

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binary-reader-interp.cc
# Opt level: O0

Result __thiscall
wabt::interp::anon_unknown_1::BinaryReaderInterp::BeginInitExpr
          (BinaryReaderInterp *this,Type type,FuncDesc *func)

{
  bool bVar1;
  Offset OVar2;
  Location local_50;
  Enum local_2c;
  FuncDesc *local_28;
  FuncDesc *func_local;
  BinaryReaderInterp *this_local;
  Type type_local;
  
  local_28 = func;
  func_local = (FuncDesc *)this;
  unique0x10000100 = type;
  std::
  vector<wabt::interp::(anonymous_namespace)::Label,_std::allocator<wabt::interp::(anonymous_namespace)::Label>_>
  ::clear(&this->label_stack_);
  this->func_ = local_28;
  OVar2 = Istream::end(this->istream_);
  this->func_->code_offset = OVar2;
  GetLocation(&local_50,this);
  local_2c = (Enum)SharedValidator::BeginInitExpr
                             (&this->validator_,&local_50,stack0xffffffffffffffec);
  bVar1 = Failed((Result)local_2c);
  if (bVar1) {
    Result::Result((Result *)&type_local,Error);
  }
  else {
    PushLabel(this,Try,0xffffffff,0xffffffff,0xffffffff);
    Result::Result((Result *)&type_local,Ok);
  }
  return (Result)type_local.enum_;
}

Assistant:

Result BinaryReaderInterp::BeginInitExpr(Type type, FuncDesc* func) {
  label_stack_.clear();
  func_ = func;
  func_->code_offset = istream_.end();
  CHECK_RESULT(validator_.BeginInitExpr(GetLocation(), type));
  // Push implicit init func label (equivalent to return).
  PushLabel(LabelKind::Try, Istream::kInvalidOffset, Istream::kInvalidOffset);
  return Result::Ok;
}